

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ConfigureStreamingOutput(UnitTestImpl *this)

{
  ulong uVar1;
  TestEventListeners *this_00;
  StreamingListener *this_01;
  undefined8 uVar2;
  string local_70;
  string local_40;
  long local_20;
  size_t pos;
  string *target;
  UnitTestImpl *this_local;
  
  pos = (size_t)FLAGS_gtest_stream_result_to_abi_cxx11_;
  target = (string *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_20 = std::__cxx11::string::find('0',0x3a);
    if (local_20 == -1) {
      uVar2 = std::__cxx11::string::c_str();
      printf("WARNING: unrecognized streaming target \"%s\" ignored.\n",uVar2);
      fflush(_stdout);
    }
    else {
      this_00 = listeners(this);
      this_01 = (StreamingListener *)operator_new(0x10);
      std::__cxx11::string::substr((ulong)&local_40,0x3e2930);
      std::__cxx11::string::substr((ulong)&local_70,0x3e2930);
      StreamingListener::StreamingListener(this_01,&local_40,&local_70);
      TestEventListeners::Append(this_00,(TestEventListener *)this_01);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return;
}

Assistant:

void UnitTestImpl::ConfigureStreamingOutput() {
  const std::string& target = GTEST_FLAG(stream_result_to);
  if (!target.empty()) {
    const size_t pos = target.find(':');
    if (pos != std::string::npos) {
      listeners()->Append(new StreamingListener(target.substr(0, pos),
                                                target.substr(pos+1)));
    } else {
      printf("WARNING: unrecognized streaming target \"%s\" ignored.\n",
             target.c_str());
      fflush(stdout);
    }
  }
}